

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O1

int ndn_signature_value_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  
  puVar4 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar4[uVar2];
  uVar8 = (uint)bVar1;
  uVar3 = decoder->input_size;
  if (bVar1 < 0xfd) {
    iVar7 = 1;
LAB_0011027e:
    decoder->offset = iVar7 + uVar2;
    iVar7 = 0;
    bVar5 = true;
  }
  else {
    if (2 < uVar3 - uVar2 && bVar1 == 0xfd) {
      uVar8 = (uint)CONCAT11(puVar4[uVar2 + 1],puVar4[uVar2 + 2]);
      iVar7 = 3;
      goto LAB_0011027e;
    }
    if (4 < uVar3 - uVar2 && uVar8 == 0xfe) {
      uVar8 = (uint)puVar4[uVar2 + 4] |
              (uint)puVar4[uVar2 + 3] << 8 |
              (uint)puVar4[uVar2 + 2] << 0x10 | (uint)puVar4[uVar2 + 1] << 0x18;
      iVar7 = 5;
      goto LAB_0011027e;
    }
    iVar7 = -0xe;
    uVar8 = 0;
    bVar5 = false;
  }
  if (!bVar5) {
    return iVar7;
  }
  if (uVar8 == 0x17) {
    _Var6 = false;
  }
  else {
    if (uVar8 != 0x2e) {
      return -0xc;
    }
    _Var6 = true;
  }
  signature->is_interest = _Var6;
  uVar2 = decoder->offset;
  bVar1 = puVar4[uVar2];
  if (bVar1 < 0xfd) {
    iVar7 = 1;
    uVar8 = (uint)bVar1;
  }
  else if (uVar3 - uVar2 < 3 || bVar1 != 0xfd) {
    if (uVar3 - uVar2 < 5 || bVar1 != 0xfe) goto LAB_00110378;
    uVar8 = (uint)puVar4[uVar2 + 4] |
            (uint)puVar4[uVar2 + 3] << 8 |
            (uint)puVar4[uVar2 + 2] << 0x10 | (uint)puVar4[uVar2 + 1] << 0x18;
    iVar7 = 5;
  }
  else {
    uVar8 = (uint)CONCAT11(puVar4[uVar2 + 1],puVar4[uVar2 + 2]);
    iVar7 = 3;
  }
  decoder->offset = iVar7 + uVar2;
LAB_00110378:
  iVar7 = -0xd;
  if (0xffffffd6 < uVar8 - 0x49) {
    signature->sig_size = uVar8;
    iVar7 = -10;
    if ((int)uVar8 <= (int)(uVar3 - decoder->offset)) {
      memcpy(signature->sig_value,puVar4 + decoder->offset,(ulong)uVar8);
      decoder->offset = decoder->offset + uVar8;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int
ndn_signature_value_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureValue) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureValue) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  ret_val = decoder_get_length(decoder, &probe);
  if (probe > NDN_SEC_MAX_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  if (probe < NDN_SEC_MIN_SIG_SIZE)
    return NDN_WRONG_TLV_LENGTH;
  signature->sig_size = probe;
  ret_val = decoder_get_raw_buffer_value(decoder, signature->sig_value, signature->sig_size);
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}